

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_buf.c
# Opt level: O0

size_t nghttp2_bufs_len(nghttp2_bufs *bufs)

{
  size_t local_20;
  size_t len;
  nghttp2_buf_chain *ci;
  nghttp2_bufs *bufs_local;
  
  local_20 = 0;
  for (len = (size_t)bufs->head; len != 0; len = *(size_t *)len) {
    local_20 = (*(long *)(len + 0x20) - *(long *)(len + 0x18)) + local_20;
  }
  return local_20;
}

Assistant:

size_t nghttp2_bufs_len(nghttp2_bufs *bufs) {
  nghttp2_buf_chain *ci;
  size_t len;

  len = 0;
  for (ci = bufs->head; ci; ci = ci->next) {
    len += nghttp2_buf_len(&ci->buf);
  }

  return len;
}